

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

CodeLocation __thiscall
soul::CodeLocation::getOffset(CodeLocation *this,uint32_t linesToAdd,uint32_t columnsToAdd)

{
  bool bVar1;
  UnicodeChar UVar2;
  uint32_t in_ECX;
  UTF8Reader extraout_RDX;
  undefined4 in_register_00000034;
  CodeLocation CVar3;
  LineAndColumn local_38;
  LineAndColumn lc;
  CodeLocation l;
  uint32_t columnsToAdd_local;
  uint32_t linesToAdd_local;
  CodeLocation *this_local;
  
  l.location.data._0_4_ = in_ECX;
  l.location.data._4_4_ = columnsToAdd;
  CodeLocation((CodeLocation *)&lc,(CodeLocation *)CONCAT44(in_register_00000034,linesToAdd));
  LineAndColumn::LineAndColumn(&local_38);
  while ((local_38.line != l.location.data._4_4_ || (local_38.column != (uint32_t)l.location.data)))
  {
    bVar1 = UTF8Reader::isEmpty((UTF8Reader *)&l);
    if (bVar1) {
      memset(this,0,0x10);
      CodeLocation(this);
LAB_003a755c:
      ~CodeLocation((CodeLocation *)&lc);
      CVar3.location.data = extraout_RDX.data;
      CVar3.sourceCode.object = (SourceCodeText *)this;
      return CVar3;
    }
    local_38.column = local_38.column + 1;
    UVar2 = UTF8Reader::operator*((UTF8Reader *)&l);
    if (UVar2 == 10) {
      local_38.column = 0;
      local_38.line = local_38.line + 1;
    }
    UTF8Reader::operator++((UTF8Reader *)&l);
  }
  CodeLocation(this,(CodeLocation *)&lc);
  goto LAB_003a755c;
}

Assistant:

CodeLocation CodeLocation::getOffset (uint32_t linesToAdd, uint32_t columnsToAdd) const
{
    auto l = *this;
    LineAndColumn lc;

    for (;;)
    {
        if (lc.line == linesToAdd && lc.column == columnsToAdd)
            return l;

        if (l.location.isEmpty())
            return {};

        ++lc.column;
        if (*(l.location) == '\n')  { lc.column = 0; lc.line++; }
        ++(l.location);
    }
}